

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.c
# Opt level: O2

_Bool save_png_image_to_file(FILE *fp,image *image)

{
  float fVar1;
  size_t sVar2;
  char cVar3;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined6 uVar11;
  undefined8 uVar12;
  unkbyte10 Var13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [14];
  short sVar16;
  undefined4 uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint __line;
  undefined1 auVar21 [16];
  void *__ptr;
  _Bool _Var22;
  int iVar23;
  png_structp ppVar24;
  __jmp_buf_tag *__env;
  char *__function;
  undefined4 *puVar25;
  undefined1 *puVar26;
  char *__file;
  size_t sVar27;
  char *__assertion;
  size_t sVar28;
  size_t sVar29;
  undefined4 *puVar30;
  undefined1 *puVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  png_structp png_ptr;
  png_infop info_ptr;
  void *local_48;
  undefined4 *local_40;
  size_t local_38;
  char cVar4;
  char cVar5;
  char cVar6;
  
  if (1 < image->channel_count - 3) {
    __assertion = "is_rgb_or_rgba_image(image)";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/io/png_image.c";
    __function = "_Bool save_png_image_to_file(FILE *, const struct image *)";
    __line = 0x74;
LAB_001062bb:
    __assert_fail(__assertion,__file,__line,__function);
  }
  ppVar24 = (png_structp)png_create_write_struct("1.6.37",0,0);
  if (ppVar24 == (png_structp)0x0) {
    _Var22 = false;
  }
  else {
    png_ptr = ppVar24;
    info_ptr = (png_infop)png_create_info_struct(ppVar24);
    if (info_ptr == (png_infop)0x0) {
      png_destroy_read_struct(&png_ptr,0);
      _Var22 = false;
    }
    else {
      __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar24,longjmp,200);
      iVar23 = _setjmp(__env);
      if (iVar23 == 0) {
        png_init_io(png_ptr,fp);
        png_set_IHDR(png_ptr,info_ptr,(int)image->width,(int)image->height,8,
                     (image->channel_count != 3) * '\x04' + '\x02',0,0,0);
        png_write_info(png_ptr,info_ptr);
        local_38 = image->channel_count;
        lVar33 = image->width * local_38;
        local_48 = xmalloc(image->height << 3);
        local_40 = (undefined4 *)xmalloc(image->height * lVar33);
        __ptr = local_48;
        auVar21 = _DAT_0010aac0;
        sVar2 = image->height;
        puVar26 = (undefined1 *)((long)local_40 + 2);
        sVar27 = 0;
        puVar25 = local_40;
        for (sVar28 = sVar27; sVar28 != sVar2; sVar28 = sVar28 + 1) {
          *(undefined4 **)((long)local_48 + sVar28 * 8) =
               (undefined4 *)(sVar28 * lVar33 + (long)local_40);
          sVar29 = image->width;
          if (local_38 < 4) {
            lVar32 = sVar29 * sVar27;
            puVar31 = puVar26;
            while (bVar34 = sVar29 != 0, sVar29 = sVar29 - 1, bVar34) {
              if (image->channel_count < 3) {
                __assertion = "x < image->width && y < image->height && image->channel_count >= 3";
                __file = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/scene/image.h"
                ;
                __function = "struct rgb get_rgb_pixel(const struct image *, size_t, size_t)";
                __line = 0x3e;
                goto LAB_001062bb;
              }
              fVar1 = *(float *)(image[1].width + lVar32);
              uVar35 = SUB41(fVar1,0);
              uVar36 = (undefined1)((uint)fVar1 >> 8);
              uVar37 = (undefined1)((uint)fVar1 >> 0x10);
              uVar38 = (undefined1)((uint)fVar1 >> 0x18);
              fVar42 = *(float *)(image[1].height + lVar32);
              fVar43 = *(float *)(image[1].channel_count + lVar32);
              if (fVar1 <= 0.0) {
                uVar35 = 0;
                uVar36 = 0;
                uVar37 = 0;
                uVar38 = 0;
              }
              if (1.0 <= (float)CONCAT13(uVar38,CONCAT12(uVar37,CONCAT11(uVar36,uVar35)))) {
                uVar35 = 0;
                uVar36 = 0;
                uVar37 = 0x80;
                uVar38 = 0x3f;
              }
              if (fVar42 <= 0.0) {
                fVar42 = 0.0;
              }
              if (1.0 <= fVar42) {
                fVar42 = 1.0;
              }
              puVar31[-2] = (char)(int)((float)CONCAT13(uVar38,CONCAT12(uVar37,CONCAT11(uVar36,
                                                  uVar35))) * 255.0);
              puVar31[-1] = (char)(int)(fVar42 * 255.0);
              if (fVar43 <= 0.0) {
                fVar43 = 0.0;
              }
              if (1.0 <= fVar43) {
                fVar43 = 1.0;
              }
              *puVar31 = (char)(int)(fVar43 * 255.0);
              lVar32 = lVar32 + 4;
              puVar31 = puVar31 + 3;
            }
          }
          else {
            lVar32 = sVar29 * sVar27;
            puVar30 = puVar25;
            while (bVar34 = sVar29 != 0, sVar29 = sVar29 - 1, bVar34) {
              if (image->channel_count < 4) {
                __assertion = "x < image->width && y < image->height && image->channel_count >= 4";
                __file = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/scene/image.h"
                ;
                __function = "struct rgba get_rgba_pixel(const struct image *, size_t, size_t)";
                __line = 0x47;
                goto LAB_001062bb;
              }
              auVar44._4_4_ = *(undefined4 *)(image[1].height + lVar32);
              auVar44._0_4_ = *(undefined4 *)(image[1].width + lVar32);
              auVar44._12_4_ = *(undefined4 *)(image[2].width + lVar32);
              auVar44._8_4_ = *(undefined4 *)(image[1].channel_count + lVar32);
              auVar45 = maxps(auVar44,ZEXT816(0));
              auVar45 = minps(auVar45,auVar21);
              iVar23 = (int)(auVar45._0_4_ * 255.0);
              iVar18 = (int)(auVar45._4_4_ * 255.0);
              cVar39 = (char)((uint)iVar18 >> 0x10);
              iVar19 = (int)(auVar45._8_4_ * 255.0);
              cVar40 = (char)((uint)iVar19 >> 0x10);
              iVar20 = (int)(auVar45._12_4_ * 255.0);
              cVar41 = (char)((uint)iVar20 >> 0x10);
              uVar11 = CONCAT15((char)((uint)iVar18 >> 8),CONCAT14((char)iVar18,iVar23));
              uVar12 = CONCAT17((char)((uint)iVar18 >> 0x18),CONCAT16(cVar39,uVar11));
              Var13 = CONCAT19((char)((uint)iVar19 >> 8),CONCAT18((char)iVar19,uVar12));
              auVar14[10] = cVar40;
              auVar14._0_10_ = Var13;
              auVar14[0xb] = (char)((uint)iVar19 >> 0x18);
              auVar15[0xc] = (char)iVar20;
              auVar15._0_12_ = auVar14;
              auVar15[0xd] = (char)((uint)iVar20 >> 8);
              auVar45[0xe] = cVar41;
              auVar45._0_14_ = auVar15;
              auVar45[0xf] = (char)((uint)iVar20 >> 0x18);
              sVar7 = (short)iVar23;
              cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar23 - (0xff < sVar7);
              sVar7 = (short)((uint)iVar23 >> 0x10);
              sVar8 = (short)((uint6)uVar11 >> 0x20);
              cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar18 - (0xff < sVar8);
              sVar8 = (short)((ulong)uVar12 >> 0x30);
              sVar9 = (short)((unkuint10)Var13 >> 0x40);
              cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar19 - (0xff < sVar9);
              sVar9 = auVar14._10_2_;
              sVar10 = auVar15._12_2_;
              cVar6 = (0 < sVar10) * (sVar10 < 0x100) * (char)iVar20 - (0xff < sVar10);
              sVar10 = auVar45._14_2_;
              sVar16 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar23 >> 0x10) -
                                (0xff < sVar7),cVar3);
              uVar17 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar39 - (0xff < sVar8),
                                CONCAT12(cVar4,sVar16));
              uVar11 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar40 - (0xff < sVar9),
                                CONCAT14(cVar5,uVar17));
              sVar7 = (short)((uint)uVar17 >> 0x10);
              sVar8 = (short)((uint6)uVar11 >> 0x20);
              sVar9 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * cVar41 - (0xff < sVar10),
                                       CONCAT16(cVar6,uVar11)) >> 0x30);
              *puVar30 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                                  CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                           CONCAT11((0 < sVar7) * (sVar7 < 0x100) * cVar4 -
                                                    (0xff < sVar7),
                                                    (0 < sVar16) * (sVar16 < 0x100) * cVar3 -
                                                    (0xff < sVar16))));
              lVar32 = lVar32 + 4;
              puVar30 = puVar30 + 1;
            }
          }
          sVar27 = sVar27 + 4;
          puVar26 = puVar26 + lVar33;
          puVar25 = (undefined4 *)((long)puVar25 + lVar33);
        }
        png_write_image(png_ptr,local_48);
        free(__ptr);
        free(local_40);
        png_write_end(png_ptr,info_ptr);
        png_destroy_write_struct(&png_ptr,&info_ptr);
        _Var22 = true;
      }
      else {
        png_destroy_write_struct(&png_ptr,&info_ptr);
        _Var22 = false;
      }
    }
  }
  return _Var22;
}

Assistant:

static bool save_png_image_to_file(FILE* fp, const struct image* image) {
    assert(is_rgb_or_rgba_image(image));

    png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    if (!png_ptr)
        return false;

    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr) {
        png_destroy_read_struct(&png_ptr, NULL, NULL);
        return false;
    }

    png_byte** row_ptrs = NULL;
    png_byte* row_bytes = NULL;
    if (setjmp(png_jmpbuf(png_ptr))) {
        if (row_ptrs)  free(row_ptrs);
        if (row_bytes) free(row_bytes);
        png_destroy_write_struct(&png_ptr, &info_ptr);
        return false;
    }

    png_init_io(png_ptr, fp);
    png_set_IHDR(
        png_ptr, info_ptr,
        image->width, image->height, 8,
        image->channel_count == 3 ? PNG_COLOR_TYPE_RGB : PNG_COLOR_TYPE_RGBA,
        PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);
    png_write_info(png_ptr, info_ptr);

    bool has_alpha = image->channel_count >= 4;
    size_t stride = image->width * image->channel_count;
    row_ptrs  = xmalloc(sizeof(png_byte*) * image->height);
    row_bytes = xmalloc(sizeof(png_byte) * stride * image->height);
    for (size_t i = 0, n = image->height; i < n; ++i) {
        row_ptrs[i] = row_bytes + stride * i;
        png_byte* row = row_bytes + stride * i;
        if (has_alpha) {
            for (size_t j = 0, m = image->width; j < m; ++j) {
                struct rgba pixel = get_rgba_pixel(image, j, i);
                row[j * 4 + 0] = clamp_real(pixel.r, 0, 1) * (real_t)255;
                row[j * 4 + 1] = clamp_real(pixel.g, 0, 1) * (real_t)255;
                row[j * 4 + 2] = clamp_real(pixel.b, 0, 1) * (real_t)255;
                row[j * 4 + 3] = clamp_real(pixel.a, 0, 1) * (real_t)255;
            }
        } else {
            for (size_t j = 0, m = image->width; j < m; ++j) {
                struct rgb pixel = get_rgb_pixel(image, j, i);
                row[j * 3 + 0] = clamp_real(pixel.r, 0, 1) * (real_t)255;
                row[j * 3 + 1] = clamp_real(pixel.g, 0, 1) * (real_t)255;
                row[j * 3 + 2] = clamp_real(pixel.b, 0, 1) * (real_t)255;
            }
        }
    }
    png_write_image(png_ptr, row_ptrs);
    free(row_ptrs);
    free(row_bytes);
    row_ptrs = NULL;
    row_bytes = NULL;

    png_write_end(png_ptr, info_ptr);
    png_destroy_write_struct(&png_ptr, &info_ptr);
    return true;
}